

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O3

ps_latlink_t * ps_lattice_traverse_next(ps_lattice_t *dag,ps_latnode_t *end)

{
  anon_union_8_4_397b8dde_for_info *paVar1;
  ps_latnode_s *ppVar2;
  ps_latlink_t *ppVar3;
  ps_latlink_t *ppVar4;
  latlink_list_t *plVar5;
  
  ppVar3 = ps_lattice_popq(dag);
  if (ppVar3 != (ps_latlink_t *)0x0) {
    paVar1 = &ppVar3->to->info;
    paVar1->fanin = paVar1->fanin + -1;
    ppVar2 = ppVar3->to;
    if ((ppVar2->info).fanin == 0) {
      if (end == (ps_latnode_t *)0x0) {
        end = dag->end;
      }
      if (ppVar2 == end) {
        do {
          ppVar4 = ps_lattice_popq(dag);
        } while (ppVar4 != (ps_latlink_t *)0x0);
      }
      else {
        for (plVar5 = ppVar2->exits; plVar5 != (latlink_list_t *)0x0; plVar5 = plVar5->next) {
          ps_lattice_pushq(dag,plVar5->link);
        }
      }
    }
  }
  return ppVar3;
}

Assistant:

ps_latlink_t *
ps_lattice_traverse_next(ps_lattice_t *dag, ps_latnode_t *end)
{
    ps_latlink_t *next;

    next = ps_lattice_popq(dag);
    if (next == NULL)
        return NULL;

    /* Decrease fanin count for destination node and expand outgoing
     * edges if all incoming edges have been seen. */
    --next->to->info.fanin;
    if (next->to->info.fanin == 0) {
        latlink_list_t *x;

        if (end == NULL) end = dag->end;
        if (next->to == end) {
            /* If we have traversed all links entering the end node,
             * clear the queue, causing future calls to this function
             * to return NULL. */
            ps_lattice_delq(dag);
            return next;
        }

        /* Extend all outgoing edges. */
        for (x = next->to->exits; x; x = x->next)
            ps_lattice_pushq(dag, x->link);
    }
    return next;
}